

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pack_sign_cp(ECDSA_SIG *s,int order,uchar *sig,size_t *siglen)

{
  size_t *in_RCX;
  void *in_RDX;
  int in_ESI;
  ECDSA_SIG *in_RDI;
  BIGNUM *sig_s;
  BIGNUM *sig_r;
  int in_stack_ffffffffffffffcc;
  uchar *buf;
  BIGNUM *bn;
  
  bn = (BIGNUM *)0x0;
  buf = (uchar *)0x0;
  ECDSA_SIG_get0(in_RDI,&stack0xffffffffffffffd8,&stack0xffffffffffffffd0);
  *in_RCX = (long)(in_ESI << 1);
  memset(in_RDX,0,*in_RCX);
  store_bignum(bn,buf,in_stack_ffffffffffffffcc);
  store_bignum(bn,buf,in_stack_ffffffffffffffcc);
  ECDSA_SIG_free(in_RDI);
  return 1;
}

Assistant:

int pack_sign_cp(ECDSA_SIG *s, int order, unsigned char *sig, size_t *siglen)
{
    const BIGNUM *sig_r = NULL, *sig_s = NULL;
    ECDSA_SIG_get0(s, &sig_r, &sig_s);
    *siglen = 2 * order;
    memset(sig, 0, *siglen);
    store_bignum(sig_s, sig, order);
    store_bignum(sig_r, sig + order, order);
    ECDSA_SIG_free(s);
    return 1;
}